

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O0

void MULTICLASS::parse_label(parser *param_1,shared_data *sd,void *v,v_array<substring> *words)

{
  vw_exception *this;
  uint64_t uVar1;
  substring *psVar2;
  ostream *poVar3;
  size_t sVar4;
  void *this_00;
  undefined8 uVar5;
  v_array<substring> *in_RCX;
  int *in_RDX;
  long in_RSI;
  char *pcVar6;
  float fVar7;
  stringstream __msg;
  label_t *ld;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  namedlabels *in_stack_fffffffffffffdd0;
  int plineNumber;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  substring in_stack_fffffffffffffe18;
  ostream local_1d0;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  int *local_28;
  v_array<substring> *local_20;
  long local_10;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  this = (vw_exception *)v_array<substring>::size(in_RCX);
  if (this != (vw_exception *)0x0) {
    if (this == (vw_exception *)0x1) {
      if (*(long *)(local_10 + 0x70) == 0) {
        psVar2 = v_array<substring>::operator[](local_20,0);
        local_38 = psVar2->begin;
        local_30 = psVar2->end;
        in_stack_fffffffffffffddc = int_of_substring(in_stack_fffffffffffffe18);
      }
      else {
        in_stack_fffffffffffffdd0 = *(namedlabels **)(local_10 + 0x70);
        v_array<substring>::operator[](local_20,0);
        uVar1 = namedlabels::get(in_stack_fffffffffffffdd0,
                                 (substring *)
                                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        in_stack_fffffffffffffddc = (int)uVar1;
      }
      *local_28 = in_stack_fffffffffffffddc;
      local_28[1] = 0x3f800000;
    }
    else if (this == (vw_exception *)0x2) {
      if (*(long *)(local_10 + 0x70) == 0) {
        psVar2 = v_array<substring>::operator[](local_20,0);
        local_48 = psVar2->begin;
        local_40 = psVar2->end;
        in_stack_fffffffffffffdcc = int_of_substring(in_stack_fffffffffffffe18);
      }
      else {
        v_array<substring>::operator[](local_20,0);
        uVar1 = namedlabels::get(in_stack_fffffffffffffdd0,
                                 (substring *)
                                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        in_stack_fffffffffffffdcc = (int)uVar1;
      }
      *local_28 = in_stack_fffffffffffffdcc;
      psVar2 = v_array<substring>::operator[](local_20,1);
      local_58 = psVar2->begin;
      local_50 = psVar2->end;
      fVar7 = float_of_substring(in_stack_fffffffffffffe18);
      local_28[1] = (int)fVar7;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"malformed example!\n");
      poVar3 = std::operator<<((ostream *)&std::cerr,"words.size() = ");
      sVar4 = v_array<substring>::size(local_20);
      this_00 = (void *)std::ostream::operator<<(poVar3,sVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  plineNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  if (*local_28 != 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe20);
  poVar3 = std::operator<<(&local_1d0,
                           "label 0 is not allowed for multiclass.  Valid labels are {1,k}");
  pcVar6 = "";
  if (*(long *)(local_10 + 0x70) != 0) {
    pcVar6 = "\nthis likely happened because you specified an invalid label with named labels";
  }
  std::operator<<(poVar3,pcVar6);
  uVar5 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (this,(char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),plineNumber,
             (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser*, shared_data* sd, void* v, v_array<substring>& words)
{
  label_t* ld = (label_t*)v;

  switch (words.size())
  {
    case 0:
      break;
    case 1:
      ld->label = sd->ldict ? (uint32_t)sd->ldict->get(words[0]) : int_of_substring(words[0]);
      ld->weight = 1.0;
      break;
    case 2:
      ld->label = sd->ldict ? (uint32_t)sd->ldict->get(words[0]) : int_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      break;
    default:
      cerr << "malformed example!\n";
      cerr << "words.size() = " << words.size() << endl;
  }
  if (ld->label == 0)
    THROW("label 0 is not allowed for multiclass.  Valid labels are {1,k}"
        << (sd->ldict ? "\nthis likely happened because you specified an invalid label with named labels" : ""));
}